

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_parse_unix_domain_url(ngx_pool_t *pool,ngx_url_t *u)

{
  u_char *p;
  u_char *last_00;
  u_char *puVar1;
  undefined1 *n;
  ngx_addr_t *pnVar2;
  sockaddr *psVar3;
  sockaddr_un *saun;
  size_t len;
  u_char *last;
  u_char *uri;
  u_char *path;
  ngx_url_t *u_local;
  ngx_pool_t *pool_local;
  
  p = (u->url).data + 5;
  saun = (sockaddr_un *)((u->url).len - 5);
  if (((byte)u->field_0x48 >> 1 & 1) != 0) {
    last_00 = p + (long)saun;
    puVar1 = ngx_strlchr(p,last_00,':');
    if (puVar1 != (u_char *)0x0) {
      saun = (sockaddr_un *)(puVar1 + -(long)p);
      (u->uri).len = (long)last_00 - (long)(puVar1 + 1);
      (u->uri).data = puVar1 + 1;
    }
  }
  if (saun == (sockaddr_un *)0x0) {
    u->err = "no path in the unix domain socket";
    pool_local = (ngx_pool_t *)0xffffffffffffffff;
  }
  else {
    n = (undefined1 *)((long)&saun->sun_family + 1);
    (u->host).len = (size_t)saun;
    (u->host).data = p;
    if (n < (undefined1 *)0x6d) {
      u->socklen = 0x6e;
      (u->sockaddr).sockaddr.sa_family = 1;
      ngx_cpystrn((u_char *)&(u->sockaddr).sockaddr_in.sin_port,p,(size_t)n);
      pnVar2 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
      u->addrs = pnVar2;
      if (u->addrs == (ngx_addr_t *)0x0) {
        pool_local = (ngx_pool_t *)0xffffffffffffffff;
      }
      else {
        psVar3 = (sockaddr *)ngx_pcalloc(pool,0x6e);
        if (psVar3 == (sockaddr *)0x0) {
          pool_local = (ngx_pool_t *)0xffffffffffffffff;
        }
        else {
          u->family = 1;
          u->naddrs = 1;
          psVar3->sa_family = 1;
          ngx_cpystrn((u_char *)psVar3->sa_data,p,(size_t)n);
          u->addrs->sockaddr = psVar3;
          u->addrs->socklen = 0x6e;
          (u->addrs->name).len = (size_t)(saun->sun_path + 3);
          (u->addrs->name).data = (u->url).data;
          pool_local = (ngx_pool_t *)0x0;
        }
      }
    }
    else {
      u->err = "too long path in the unix domain socket";
      pool_local = (ngx_pool_t *)0xffffffffffffffff;
    }
  }
  return (ngx_int_t)pool_local;
}

Assistant:

static ngx_int_t
ngx_parse_unix_domain_url(ngx_pool_t *pool, ngx_url_t *u)
{
#if (NGX_HAVE_UNIX_DOMAIN)
    u_char              *path, *uri, *last;
    size_t               len;
    struct sockaddr_un  *saun;

    len = u->url.len;
    path = u->url.data;

    path += 5;
    len -= 5;

    if (u->uri_part) {

        last = path + len;
        uri = ngx_strlchr(path, last, ':');

        if (uri) {
            len = uri - path;
            uri++;
            u->uri.len = last - uri;
            u->uri.data = uri;
        }
    }

    if (len == 0) {
        u->err = "no path in the unix domain socket";
        return NGX_ERROR;
    }

    u->host.len = len++;
    u->host.data = path;

    if (len > sizeof(saun->sun_path)) {
        u->err = "too long path in the unix domain socket";
        return NGX_ERROR;
    }

    u->socklen = sizeof(struct sockaddr_un);
    saun = (struct sockaddr_un *) &u->sockaddr;
    saun->sun_family = AF_UNIX;
    (void) ngx_cpystrn((u_char *) saun->sun_path, path, len);

    u->addrs = ngx_pcalloc(pool, sizeof(ngx_addr_t));
    if (u->addrs == NULL) {
        return NGX_ERROR;
    }

    saun = ngx_pcalloc(pool, sizeof(struct sockaddr_un));
    if (saun == NULL) {
        return NGX_ERROR;
    }

    u->family = AF_UNIX;
    u->naddrs = 1;

    saun->sun_family = AF_UNIX;
    (void) ngx_cpystrn((u_char *) saun->sun_path, path, len);

    u->addrs[0].sockaddr = (struct sockaddr *) saun;
    u->addrs[0].socklen = sizeof(struct sockaddr_un);
    u->addrs[0].name.len = len + 4;
    u->addrs[0].name.data = u->url.data;

    return NGX_OK;

#else

    u->err = "the unix domain sockets are not supported on this platform";

    return NGX_ERROR;

#endif
}